

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::clear(dxt_hc *this)

{
  undefined8 *puVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  void *pvVar3;
  float *p;
  uchar *p_00;
  uint *puVar4;
  unsigned_long_long *p_01;
  bool *pbVar5;
  endpoint_indices_details *p_02;
  selector_indices_details *p_03;
  tile_details *ptVar6;
  ulong uVar7;
  long lVar8;
  color_cluster *pcVar9;
  alpha_cluster *paVar10;
  color_cluster *pcVar11;
  alpha_cluster *paVar12;
  
  this->m_blocks = (color_quad_u8 (*) [16])0x0;
  this->m_num_blocks = 0;
  this->m_num_alpha_blocks = 0;
  this->m_has_color_blocks = false;
  pcVar9 = (this->m_color_clusters).m_p;
  if (pcVar9 != (color_cluster *)0x0) {
    uVar7 = (ulong)(this->m_color_clusters).m_size;
    if (uVar7 != 0) {
      pcVar11 = pcVar9 + uVar7;
      do {
        pcVar2 = (pcVar9->pixels).m_p;
        if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar2);
        }
        lVar8 = 0x30;
        do {
          pvVar3 = *(void **)((long)(pcVar9->blocks + -1) + lVar8);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar8 = lVar8 + -0x10;
        } while (lVar8 != 0);
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pcVar11);
    }
    crnlib_free((this->m_color_clusters).m_p);
    (this->m_color_clusters).m_p = (color_cluster *)0x0;
    (this->m_color_clusters).m_size = 0;
    (this->m_color_clusters).m_capacity = 0;
  }
  paVar10 = (this->m_alpha_clusters).m_p;
  if (paVar10 != (alpha_cluster *)0x0) {
    uVar7 = (ulong)(this->m_alpha_clusters).m_size;
    if (uVar7 != 0) {
      paVar12 = paVar10 + uVar7;
      do {
        pcVar2 = (paVar10->pixels).m_p;
        if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar2);
        }
        lVar8 = 0x30;
        do {
          pvVar3 = *(void **)((long)(paVar10->blocks + -1) + lVar8);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar8 = lVar8 + -0x10;
        } while (lVar8 != 0);
        paVar10 = paVar10 + 1;
      } while (paVar10 != paVar12);
    }
    crnlib_free((this->m_alpha_clusters).m_p);
    (this->m_alpha_clusters).m_p = (alpha_cluster *)0x0;
    (this->m_alpha_clusters).m_size = 0;
    (this->m_alpha_clusters).m_capacity = 0;
  }
  this->m_canceled = false;
  this->m_prev_phase_index = -1;
  this->m_prev_percentage_complete = -1;
  p = (this->m_block_weights).m_p;
  if (p != (float *)0x0) {
    crnlib_free(p);
    (this->m_block_weights).m_p = (float *)0x0;
    (this->m_block_weights).m_size = 0;
    (this->m_block_weights).m_capacity = 0;
  }
  p_00 = (this->m_block_encodings).m_p;
  if (p_00 != (uchar *)0x0) {
    crnlib_free(p_00);
    (this->m_block_encodings).m_p = (uchar *)0x0;
    (this->m_block_encodings).m_size = 0;
    (this->m_block_encodings).m_capacity = 0;
  }
  lVar8 = 0x668;
  do {
    pvVar3 = *(void **)((long)(this->m_color_derating + -1) + 0xc + lVar8);
    if (pvVar3 != (void *)0x0) {
      puVar1 = (undefined8 *)((long)(this->m_color_derating + -1) + 0xc + lVar8);
      crnlib_free(pvVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x698);
  puVar4 = (this->m_color_selectors).m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_color_selectors).m_p = (uint *)0x0;
    (this->m_color_selectors).m_size = 0;
    (this->m_color_selectors).m_capacity = 0;
  }
  p_01 = (this->m_alpha_selectors).m_p;
  if (p_01 != (unsigned_long_long *)0x0) {
    crnlib_free(p_01);
    (this->m_alpha_selectors).m_p = (unsigned_long_long *)0x0;
    (this->m_alpha_selectors).m_size = 0;
    (this->m_alpha_selectors).m_capacity = 0;
  }
  pbVar5 = (this->m_color_selectors_used).m_p;
  if (pbVar5 != (bool *)0x0) {
    crnlib_free(pbVar5);
    (this->m_color_selectors_used).m_p = (bool *)0x0;
    (this->m_color_selectors_used).m_size = 0;
    (this->m_color_selectors_used).m_capacity = 0;
  }
  pbVar5 = (this->m_alpha_selectors_used).m_p;
  if (pbVar5 != (bool *)0x0) {
    crnlib_free(pbVar5);
    (this->m_alpha_selectors_used).m_p = (bool *)0x0;
    (this->m_alpha_selectors_used).m_size = 0;
    (this->m_alpha_selectors_used).m_capacity = 0;
  }
  puVar4 = (this->m_tile_indices).m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_tile_indices).m_p = (uint *)0x0;
    (this->m_tile_indices).m_size = 0;
    (this->m_tile_indices).m_capacity = 0;
  }
  p_02 = (this->m_endpoint_indices).m_p;
  if (p_02 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_02);
    (this->m_endpoint_indices).m_p = (endpoint_indices_details *)0x0;
    (this->m_endpoint_indices).m_size = 0;
    (this->m_endpoint_indices).m_capacity = 0;
  }
  p_03 = (this->m_selector_indices).m_p;
  if (p_03 != (selector_indices_details *)0x0) {
    crnlib_free(p_03);
    (this->m_selector_indices).m_p = (selector_indices_details *)0x0;
    (this->m_selector_indices).m_size = 0;
    (this->m_selector_indices).m_capacity = 0;
  }
  ptVar6 = (this->m_tiles).m_p;
  if (ptVar6 != (tile_details *)0x0) {
    uVar7 = (ulong)(this->m_tiles).m_size;
    if (uVar7 != 0) {
      lVar8 = 0;
      do {
        pvVar3 = *(void **)((long)(ptVar6->color_endpoint).m_s + lVar8 + -0x14);
        if (pvVar3 != (void *)0x0) {
          crnlib_free(pvVar3);
        }
        lVar8 = lVar8 + 0x48;
      } while (uVar7 * 0x48 != lVar8);
    }
    crnlib_free((this->m_tiles).m_p);
    (this->m_tiles).m_p = (tile_details *)0x0;
    (this->m_tiles).m_size = 0;
    (this->m_tiles).m_capacity = 0;
  }
  this->m_num_tiles = 0;
  return;
}

Assistant:

void dxt_hc::clear()
    {
        m_blocks = 0;
        m_num_blocks = 0;
        m_num_alpha_blocks = 0;
        m_has_color_blocks = false;

        m_color_clusters.clear();
        m_alpha_clusters.clear();

        m_canceled = false;

        m_prev_phase_index = -1;
        m_prev_percentage_complete = -1;

        m_block_weights.clear();
        m_block_encodings.clear();
        for (uint c = 0; c < 3; c++)
        {
            m_block_selectors[c].clear();
        }
        m_color_selectors.clear();
        m_alpha_selectors.clear();
        m_color_selectors_used.clear();
        m_alpha_selectors_used.clear();
        m_tile_indices.clear();
        m_endpoint_indices.clear();
        m_selector_indices.clear();
        m_tiles.clear();
        m_num_tiles = 0;
    }